

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O3

void __thiscall Assimp::MD5Importer::MakeDataUnique(MD5Importer *this,MeshDesc *meshSrc)

{
  uint uVar1;
  pointer pVVar2;
  pointer pVVar3;
  pointer paVar4;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  pointer paVar8;
  runtime_error *this_00;
  long lVar9;
  ulong uVar10;
  allocator_type local_71;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  vector<bool,_std::allocator<bool>_> local_50;
  
  local_70[0] = (undefined1 *)((ulong)local_70[0] & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_50,
             (long)(meshSrc->mVertices).
                   super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(meshSrc->mVertices).
                   super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(bool *)local_70,&local_71);
  pVVar2 = (meshSrc->mVertices).
           super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar7 = (ulong)(uint)((int)((ulong)((long)(meshSrc->mFaces).
                                            super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)(meshSrc->mFaces).
                                           super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 4) * 3);
  pVVar3 = (meshSrc->mVertices).
           super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::resize
            (&meshSrc->mVertices,uVar7);
  uVar10 = (ulong)((long)pVVar2 - (long)pVVar3) >> 4;
  uVar7 = (ulong)((float)uVar7 *
                 ((float)(ulong)(((long)(meshSrc->mWeights).
                                        super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(meshSrc->mWeights).
                                        super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                -0x3333333333333333) / (float)(uVar10 & 0xffffffff)));
  std::vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>::reserve
            (&meshSrc->mWeights,(ulong)(((uint)(uVar7 >> 3) & 0x1fffffff) + (int)uVar7));
  paVar8 = (meshSrc->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar4 = (meshSrc->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (paVar8 == paVar4) {
      if (local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      return;
    }
    lVar9 = 0;
    do {
      pVVar2 = (meshSrc->mVertices).
               super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(meshSrc->mVertices).
                        super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4) <=
          (ulong)*paVar8->mIndices) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_70,"MD5MESH: Invalid vertex index","");
        std::runtime_error::runtime_error(this_00,(string *)local_70);
        *(undefined ***)this_00 = &PTR__runtime_error_008dc448;
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar1 = paVar8->mIndices[lVar9];
      if ((local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
        local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] =
             1L << ((byte)uVar1 & 0x3f) |
             local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar1 >> 6];
      }
      else {
        pVVar3 = pVVar2 + uVar1;
        uVar1 = pVVar3->mFirstWeight;
        uVar6 = pVVar3->mNumWeights;
        pVVar2 = pVVar2 + (uVar10 & 0xffffffff);
        pVVar2->mUV = pVVar3->mUV;
        pVVar2->mFirstWeight = uVar1;
        pVVar2->mNumWeights = uVar6;
        paVar8->mIndices[lVar9] = (uint)uVar10;
        uVar10 = (ulong)((uint)uVar10 + 1);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    puVar5 = paVar8->mIndices;
    uVar1 = *puVar5;
    *puVar5 = puVar5[2];
    puVar5[2] = uVar1;
    paVar8 = paVar8 + 1;
  } while( true );
}

Assistant:

void MD5Importer::MakeDataUnique (MD5::MeshDesc& meshSrc)
{
    std::vector<bool> abHad(meshSrc.mVertices.size(),false);

    // allocate enough storage to keep the output structures
    const unsigned int iNewNum = static_cast<unsigned int>(meshSrc.mFaces.size()*3);
    unsigned int iNewIndex = static_cast<unsigned int>(meshSrc.mVertices.size());
    meshSrc.mVertices.resize(iNewNum);

    // try to guess how much storage we'll need for new weights
    const float fWeightsPerVert = meshSrc.mWeights.size() / (float)iNewIndex;
    const unsigned int guess = (unsigned int)(fWeightsPerVert*iNewNum);
    meshSrc.mWeights.reserve(guess + (guess >> 3)); // + 12.5% as buffer

    for (FaceList::const_iterator iter = meshSrc.mFaces.begin(),iterEnd = meshSrc.mFaces.end();iter != iterEnd;++iter){
        const aiFace& face = *iter;
        for (unsigned int i = 0; i < 3;++i) {
            if (face.mIndices[0] >= meshSrc.mVertices.size()) {
                throw DeadlyImportError("MD5MESH: Invalid vertex index");
            }

            if (abHad[face.mIndices[i]])    {
                // generate a new vertex
                meshSrc.mVertices[iNewIndex] = meshSrc.mVertices[face.mIndices[i]];
                face.mIndices[i] = iNewIndex++;
            }
            else abHad[face.mIndices[i]] = true;
        }
        // swap face order
        std::swap(face.mIndices[0],face.mIndices[2]);
    }
}